

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O2

bool libwebm::vttdemux::WriteChaptersFile(metadata_map_t *m,Segment *s)

{
  _Base_ptr f;
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator cVar4;
  Chapters *this;
  Edition *this_00;
  Atom *this_01;
  Display *this_02;
  char *pcVar5;
  int index;
  bool bVar6;
  key_type local_38;
  
  local_38 = 0;
  cVar4 = std::
          _Rb_tree<long,_std::pair<const_long,_libwebm::vttdemux::MetadataInfo>,_std::_Select1st<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
          ::find(&m->_M_t,&local_38);
  bVar6 = true;
  if (((_Rb_tree_header *)cVar4._M_node != &(m->_M_t)._M_impl.super__Rb_tree_header) &&
     (this = mkvparser::Segment::GetChapters(s), this != (Chapters *)0x0)) {
    f = cVar4._M_node[1]._M_left;
    iVar2 = mkvparser::Chapters::GetEditionCount(this);
    if (0 < iVar2) {
      if (iVar2 == 1) {
        index = 0;
        this_00 = mkvparser::Chapters::GetEdition(this,0);
        iVar2 = mkvparser::Chapters::Edition::GetAtomCount(this_00);
        if (iVar2 < 1) {
          iVar2 = index;
        }
        for (; bVar6 = iVar2 == index, !bVar6; index = index + 1) {
          this_01 = mkvparser::Chapters::Edition::GetAtom(this_00,index);
          iVar3 = mkvparser::Chapters::Atom::GetDisplayCount(this_01);
          if (0 < iVar3) {
            if (iVar3 != 1) {
              pcVar5 = "more than 1 display in atom detected";
              goto LAB_0010eb95;
            }
            this_02 = mkvparser::Chapters::Atom::GetDisplay(this_01,0);
            pcVar5 = mkvparser::Chapters::Display::GetLanguage(this_02);
            if ((pcVar5 != (char *)0x0) && (iVar3 = strcmp(pcVar5,"eng"), iVar3 != 0)) {
              pcVar5 = "only English-language chapter cues are supported";
              goto LAB_0010eb95;
            }
            bVar1 = WriteChaptersCue((FILE *)f,this,this_01,this_02);
            if (!bVar1) {
              return bVar6;
            }
          }
        }
      }
      else {
        pcVar5 = "more than one chapter edition detected";
LAB_0010eb95:
        puts(pcVar5);
        bVar6 = false;
      }
    }
  }
  return bVar6;
}

Assistant:

bool vttdemux::WriteChaptersFile(const metadata_map_t& m,
                                 const mkvparser::Segment* s) {
  const metadata_map_t::const_iterator info_iter = m.find(kChaptersKey);
  if (info_iter == m.end())  // no chapters, so nothing to do
    return true;

  const mkvparser::Chapters* const chapters = s->GetChapters();
  if (chapters == NULL)  // weird
    return true;

  const MetadataInfo& info = info_iter->second;
  FILE* const file = info.file;

  const int edition_count = chapters->GetEditionCount();

  if (edition_count <= 0)  // weird
    return true;  // nothing to do

  if (edition_count > 1) {
    // TODO(matthewjheaney): figure what to do here
    printf("more than one chapter edition detected\n");
    return false;
  }

  const mkvparser::Chapters::Edition* const edition = chapters->GetEdition(0);

  const int atom_count = edition->GetAtomCount();

  for (int idx = 0; idx < atom_count; ++idx) {
    const mkvparser::Chapters::Atom* const atom = edition->GetAtom(idx);
    const int display_count = atom->GetDisplayCount();

    if (display_count <= 0)
      continue;

    if (display_count > 1) {
      // TODO(matthewjheaney): handle case of multiple languages
      printf("more than 1 display in atom detected\n");
      return false;
    }

    const mkvparser::Chapters::Display* const display = atom->GetDisplay(0);

    if (const char* language = display->GetLanguage()) {
      if (strcmp(language, "eng") != 0) {
        // TODO(matthewjheaney): handle case of multiple languages.

        // We must create a separate webvtt file for each language.
        // This isn't a simple problem (which is why we defer it for
        // now), because there's nothing in the header that tells us
        // what languages we have as cues.  We must parse the displays
        // of each atom to determine that.

        // One solution is to make two passes over the input data.
        // First parse the displays, creating an in-memory cache of
        // all the chapter cues, sorted according to their language.
        // After we have read all of the chapter atoms from the input
        // file, we can then write separate output files for each
        // language.

        printf("only English-language chapter cues are supported\n");
        return false;
      }
    }

    if (!WriteChaptersCue(file, chapters, atom, display))
      return false;
  }

  return true;
}